

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

bool anon_unknown.dwarf_baca8::is_expected_dir(dirent *d,not_null<const_directory_*> expected)

{
  bool bVar1;
  const_reference this;
  bool local_39;
  directory *local_38;
  undefined1 local_30 [8];
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> od;
  dirent *d_local;
  not_null<const_directory_*> expected_local;
  
  od._16_8_ = d;
  d_local = (dirent *)expected.ptr_;
  pstore::romfs::dirent::opendir((dirent *)local_30,(char *)d);
  bVar1 = pstore::error_or::operator_cast_to_bool((error_or *)local_30);
  local_39 = false;
  if (bVar1) {
    this = pstore::error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::operator*
                     ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)local_30
                     );
    local_38 = pstore::gsl::not_null::operator_cast_to_directory_((not_null *)&d_local);
    local_39 = pstore::gsl::not_null<const_pstore::romfs::directory_*>::operator==(this,&local_38);
  }
  pstore::error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or
            ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)local_30);
  return local_39;
}

Assistant:

bool is_expected_dir (dirent const & d, not_null<directory const *> const expected) {
        auto const od = d.opendir ();
        return od && *od == expected;
    }